

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O1

bool __thiscall WellFounded::propRule(WellFounded *this,ConjRule *r)

{
  bool *pbVar1;
  bool bVar2;
  ulong uVar3;
  int x;
  uint local_24;
  ConjRule *local_20;
  
  uVar3 = (ulong)r->w;
  if (-1 < (long)uVar3) {
    pbVar1 = (this->no_support_bool).data;
    do {
      if (pbVar1[(uint)r->body[uVar3]] != false) goto LAB_001d634d;
      r->w = (int)(uVar3 - 1);
      bVar2 = 0 < (long)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
    uVar3 = 0xffffffff;
  }
LAB_001d634d:
  if ((int)uVar3 < 0) {
    (this->no_support_bool).data[(uint)r->head] = false;
    vec<int>::push(&this->nfset,&r->head);
    (this->support).data[(uint)r->head] = r;
  }
  else {
    local_24 = r->body[uVar3 & 0xffffffff];
    local_20 = r;
    vec<ConjRule_*>::push((this->watches).data + local_24,&local_20);
    if ((this->ufset_bool).data[local_24] == false) {
      vec<int>::push(&this->ufset,(int *)&local_24);
      (this->ufset_bool).data[local_24] = true;
    }
  }
  return (bool)((byte)(uVar3 >> 0x18) >> 7);
}

Assistant:

bool propRule(ConjRule& r) {
		for (; r.w >= 0; r.w--) {
			if (no_support_bool[r.body[r.w]]) {
				break;
			}
		}
		if (r.w < 0) {
			if (DEBUG) {
				printf("found support for %d\n", r.head);
			}
			// all literals are founded, make h founded.
			no_support_bool[r.head] = false;
			nfset.push(r.head);
			support[r.head] = &r;
			return true;
		}
		const int x = r.body[r.w];
		watches[x].push(&r);
		if (!ufset_bool[x]) {
			if (DEBUG) {
				printf("%d added to ufset\n", x);
			}
			ufset.push(x);
			ufset_bool[x] = true;
		}
		return false;
	}